

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall
ON_Mesh::SetTextureCoordinatesEx
          (ON_Mesh *this,ON_TextureMapping *mapping,ON_Xform *mesh_xform,bool bLazy,bool bSeamCheck)

{
  ON_2fPoint OVar1;
  TYPE TVar2;
  int iVar3;
  ON_2fPoint *pOVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ON_Xform *pOVar12;
  ON_Xform *pOVar13;
  int *Tsd;
  ON_SimpleArray<int> *Tside_00;
  long lVar14;
  byte bVar15;
  ON_SimpleArray<int> Tside;
  ON_TextureMapping mp;
  double local_2b8;
  ON_SimpleArray<int> local_2b0;
  undefined1 local_298 [16];
  double local_288;
  ON_3dPoint local_278;
  ON_TextureMapping local_260;
  
  bVar15 = 0;
  TVar2 = mapping->m_type;
  if ((TVar2 != srfp_mapping) &&
     (((((mapping->m_projection == ray_projection || (TVar2 == wcsbox_projection)) ||
        (TVar2 == box_mapping)) || ((TVar2 == cylinder_mapping && (mapping->m_bCapped == true)))) &&
      (bVar6 = HasVertexNormals(this), !bVar6)))) {
    ComputeVertexNormals(this);
  }
  InvalidateTextureCoordinateBoundingBox(this);
  local_2b0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
  local_2b0.m_a = (int *)0x0;
  local_2b0.m_count = 0;
  local_2b0.m_capacity = 0;
  ON_TextureMapping::ON_TextureMapping(&local_260,mapping);
  if (!bSeamCheck) goto LAB_004dfcd9;
  local_2b8 = 1.0;
  if (local_260.m_type == cylinder_mapping) {
    if (local_260.m_texture_space == divided) {
      local_2b8 = 0.6666666666666666;
      Tside_00 = &local_2b0;
    }
    else {
      Tside_00 = (ON_SimpleArray<int> *)0x0;
    }
  }
  else {
    Tside_00 = (ON_SimpleArray<int> *)0x0;
    if (local_260.m_type != sphere_mapping) {
      if (local_260.m_type != box_mapping) {
LAB_004dfcd9:
        local_2b8 = 1.0;
        Tside_00 = (ON_SimpleArray<int> *)0x0;
        bVar6 = false;
        goto LAB_004dfd54;
      }
      Tside_00 = &local_2b0;
      if (local_260.m_texture_space != single) {
        if (local_260.m_texture_space != divided) goto LAB_004dfcd9;
        if (local_260.m_bCapped == true) {
          local_2b8 = 0.6666666666666666;
        }
      }
    }
  }
  iVar3 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  iVar9 = TriangleCount(this);
  iVar10 = QuadCount(this);
  if (iVar3 < iVar9 * 3 + iVar10 * 4) {
    pOVar12 = &ON_Xform::IdentityTransformation;
    pOVar13 = &local_260.m_uvw;
    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
      pOVar13->m_xform[0][0] = pOVar12->m_xform[0][0];
      pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar15 * -2 + 1) * 8);
      pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
    }
    bVar6 = true;
  }
  else {
    bVar6 = false;
  }
LAB_004dfd54:
  bVar7 = ON_TextureMapping::GetTextureCoordinates
                    (&local_260,this,&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,mesh_xform,bLazy,
                     Tside_00);
  if (Tside_00 != (ON_SimpleArray<int> *)0x0) {
    bVar6 = (bool)(bVar6 & Tside_00->m_count != 0);
  }
  if (bVar7) {
    ON_MappingTag::Set(&this->m_Ttag,mapping);
    if (((mesh_xform != (ON_Xform *)0x0) && (bVar8 = ON_Xform::IsValid(mesh_xform), bVar8)) &&
       ((bVar8 = ON_Xform::IsIdentity(mesh_xform,0.0), !bVar8 &&
        (bVar8 = ON_Xform::IsZero(mesh_xform), !bVar8)))) {
      pOVar12 = mesh_xform;
      pOVar13 = &(this->m_Ttag).m_mesh_xform;
      for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
        pOVar13->m_xform[0][0] = pOVar12->m_xform[0][0];
        pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar15 * -2 + 1) * 8);
        pOVar13 = (ON_Xform *)((long)pOVar13 + (ulong)bVar15 * -0x10 + 8);
      }
    }
    if ((bVar6) && (bVar6 = HasTextureCoordinates(this), bVar6 && 0 < (this->m_F).m_count)) {
      if ((Tside_00 == (ON_SimpleArray<int> *)0x0) ||
         (Tsd = local_2b0.m_a,
         local_2b0.m_count != (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) {
        Tsd = (int *)0x0;
      }
      AdjustMeshPeriodicTextureCoordinatesHelper
                (this,mesh_xform,&((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a)->x,2,Tsd,
                 local_2b8,&local_260);
      pOVar12 = &mapping->m_uvw;
      bVar6 = ON_Xform::IsIdentity(pOVar12,0.0);
      if (((!bVar6) && (bVar6 = ON_Xform::IsZero(pOVar12), !bVar6)) &&
         (lVar11 = (long)(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count, 0 < lVar11)) {
        pOVar4 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
        lVar14 = 0;
        do {
          OVar1 = pOVar4[lVar14];
          dVar5 = (double)OVar1.y;
          local_298._8_4_ = SUB84(dVar5,0);
          local_298._0_8_ = (double)OVar1.x;
          local_298._12_4_ = (int)((ulong)dVar5 >> 0x20);
          local_288 = 0.0;
          ON_Xform::operator*(&local_278,pOVar12,(ON_3dPoint *)local_298);
          local_288 = local_278.z;
          OVar1.y = (float)local_278.y;
          OVar1.x = (float)local_278.x;
          pOVar4[lVar14] = OVar1;
          lVar14 = lVar14 + 1;
        } while (lVar11 != lVar14);
      }
    }
  }
  ON_TextureMapping::~ON_TextureMapping(&local_260);
  ON_SimpleArray<int>::~ON_SimpleArray(&local_2b0);
  return bVar7;
}

Assistant:

bool ON_Mesh::SetTextureCoordinatesEx(
                  const class ON_TextureMapping& mapping,
                  const class ON_Xform* mesh_xform,
                  bool bLazy,
                  bool bSeamCheck
                  )
{
  if ( mapping.RequiresVertexNormals() && !HasVertexNormals() )
    ComputeVertexNormals();

  InvalidateTextureCoordinateBoundingBox();

  ON_SimpleArray<int> Tside;
  ON_SimpleArray<int>* Tsd = 0;
  ON_TextureMapping mp = mapping;

  double two_pi_tc = 1.0;

  if (bSeamCheck)
  {
    bSeamCheck = SeamCheckHelper(mp, two_pi_tc, Tside, Tsd) && HasSharedVertices(*this);
    if (bSeamCheck)
      mp.m_uvw = ON_Xform::IdentityTransformation;
  }

  // Use mp instead of mapping to call GetTextureCoordinates()
  // because m_uvw must be the identity if we have seams.
  bool rc = mp.GetTextureCoordinates(*this,m_T,mesh_xform,bLazy,Tsd);

  if (Tsd != nullptr && Tsd->Count() == 0)
  {
    // Tsd array is needed for seam check but it was not filled by GetTextureCoordinates.
    // This happened because matching texture coordinates were found. These coordinates
    // were already once seam checked. So seam check can be skipped now.
    bSeamCheck = false;
  }

  if (rc)
  {
    // update the texture coordinate tag
    m_Ttag.Set(mapping);
    if (    mesh_xform
         && mesh_xform->IsValid()
         && !mesh_xform->IsIdentity()
         && !mesh_xform->IsZero()
       )
    {
      m_Ttag.m_mesh_xform  = *mesh_xform;
    }
  }

  if ( rc && bSeamCheck && HasTextureCoordinates() && m_F.Count() > 0 )
  {
    float* mesh_T = (float*)m_T.Array();
    int mesh_T_stride = sizeof(m_T[0])/sizeof(mesh_T[0]);
    if ( Tsd && Tside.Count() != m_V.Count() )
      Tsd = 0;
    AdjustMeshPeriodicTextureCoordinatesHelper( *this, mesh_xform, mesh_T, mesh_T_stride, Tsd ? Tside.Array() : 0, two_pi_tc, mp );
    mesh_T = 0; // when the array is grown, the pointer may become invalid
    if ( !mapping.m_uvw.IsIdentity() && !mapping.m_uvw.IsZero() )
    {
      // Apply the uvw transformation that is on mapping
      // to the texture coordinates.
      ON_2fPoint* meshT = m_T.Array();
      ON_3dPoint T;
      int vi, vcnt = m_T.Count();
      for ( vi = 0; vi < vcnt; vi++ )
      {
        T.x = meshT[vi].x;
        T.y = meshT[vi].y;
        T.z = 0.0;
        T = mapping.m_uvw*T;
        meshT[vi].x = (float)T.x;
        meshT[vi].y = (float)T.y;
      }
    }
  }

  return rc;
}